

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O2

void __thiscall
TEST_PlayerHandTest_LastDrawTile_Test::testBody(TEST_PlayerHandTest_LastDrawTile_Test *this)

{
  Tile TVar1;
  UtestShell *pUVar2;
  PlayerHand *this_00;
  TestTerminatorWithoutExceptions local_28;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h;
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  pUVar2 = UtestShell::getCurrent();
  TVar1 = mahjong::PlayerHand::lastTile(this_00);
  local_28.super_TestTerminator._vptr_TestTerminator = (TestTerminator)&PTR_exitCurrentTest_001e18b8
  ;
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(TVar1 == OneOfCircles),"CHECK","Tile::OneOfCircles == h.lastTile()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x10,&local_28);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_28);
  mahjong::PlayerHand::add(this_00,TwoOfCircles);
  pUVar2 = UtestShell::getCurrent();
  TVar1 = mahjong::PlayerHand::lastTile(this_00);
  local_28.super_TestTerminator._vptr_TestTerminator = (TestTerminator)&PTR_exitCurrentTest_001e18b8
  ;
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(TVar1 == TwoOfCircles),"CHECK","Tile::TwoOfCircles == h.lastTile()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x13,&local_28);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_28);
  return;
}

Assistant:

TEST(PlayerHandTest, LastDrawTile)
{
	h.add(Tile::OneOfCircles);
	CHECK(Tile::OneOfCircles == h.lastTile());

	h.add(Tile::TwoOfCircles);
	CHECK(Tile::TwoOfCircles == h.lastTile());
}